

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipartiteGraph.cpp
# Opt level: O1

vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
* BipartiteGraph::getIncidenceMatrix
            (vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
             *__return_storage_ptr__,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges1,
            vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges2)

{
  _Elt_pointer pbVar1;
  pointer pPVar2;
  pointer pdVar3;
  _Elt_pointer pbVar4;
  ulong uVar5;
  bool bVar6;
  _Elt_pointer pbVar7;
  ulong uVar8;
  pointer pPVar9;
  ulong uVar10;
  long lVar11;
  allocator_type local_93;
  allocator_type local_92;
  value_type local_91;
  ulong local_90;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_88;
  _Deque_base<bool,_std::allocator<bool>_> local_80;
  
  pPVar9 = (edges1->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (edges1->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_91 = false;
  local_88 = edges1;
  std::deque<bool,_std::allocator<bool>_>::deque
            ((deque<bool,_std::allocator<bool>_> *)&local_80,
             ((long)(edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,&local_91,
             &local_92);
  std::
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  ::vector(__return_storage_ptr__,((long)pPVar2 - (long)pPVar9 >> 3) * -0x71c71c71c71c71c7,
           (value_type *)&local_80,&local_93);
  std::_Deque_base<bool,_std::allocator<bool>_>::~_Deque_base(&local_80);
  if ((local_88->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_88->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_90 = 0;
    do {
      uVar5 = local_90;
      pPVar9 = (edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
          super__Vector_impl_data._M_finish != pPVar9) {
        lVar11 = 0;
        uVar8 = 0;
        do {
          bVar6 = Bipartition::crosses
                            (&(local_88->
                              super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar5].super_Bipartition,
                             (Bipartition *)
                             ((long)&(pPVar9->super_Bipartition)._vptr_Bipartition + lVar11));
          pdVar3 = (__return_storage_ptr__->
                   super__Vector_base<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar7 = ((iterator *)
                   ((long)&pdVar3[uVar5].super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                           super__Deque_impl_data + 0x10))->_M_cur;
          pbVar4 = *(_Elt_pointer *)
                    ((long)&pdVar3[uVar5].super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                            super__Deque_impl_data + 0x18);
          pbVar1 = pbVar7 + (uVar8 - (long)pbVar4);
          if ((_Elt_pointer)0x1ff < pbVar1) {
            uVar10 = ((ulong)pbVar1 >> 9) + 0xff80000000000000;
            if (0 < (long)pbVar1) {
              uVar10 = (ulong)pbVar1 >> 9;
            }
            pbVar7 = (*(_Map_pointer *)
                       ((long)&pdVar3[uVar5].super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                               super__Deque_impl_data + 0x28))[uVar10] +
                     (long)(pbVar7 + (uVar10 * -0x200 - (long)pbVar4));
          }
          pbVar7[uVar8] = bVar6;
          uVar8 = uVar8 + 1;
          pPVar9 = (edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x48;
        } while (uVar8 < (ulong)(((long)(edges2->
                                        super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9
                                 >> 3) * -0x71c71c71c71c71c7));
      }
      local_90 = local_90 + 1;
    } while (local_90 <
             (ulong)(((long)(local_88->
                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_88->
                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<deque<bool>> BipartiteGraph::getIncidenceMatrix(vector<PhyloTreeEdge>& edges1, vector<PhyloTreeEdge>& edges2) {
    std::vector<std::deque<bool>> incidenceMatrix(edges1.size(), std::deque<bool>(edges2.size(), false));
    for (size_t i = 0; i < edges1.size(); i++) {
        for (size_t j = 0; j < edges2.size(); j++) {
            incidenceMatrix[i][j] = edges1[i].crosses(edges2[j]);
        }
    }
    return incidenceMatrix;
}